

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLut.c
# Opt level: O1

int Abc_NtkSuperChoiceLut(Abc_Ntk_t *pNtk,int nLutSize,int nCutSizeMax,int fVerbose)

{
  int *pBSet;
  char cVar1;
  char cVar2;
  Abc_Obj_t *pObj;
  uint *puVar3;
  Abc_Ntk_t *pNtk_00;
  uint *puVar4;
  void **ppvVar5;
  void *pvVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  Abc_ManScl_t *pManScl;
  uint **ppuVar10;
  uint **ppuVar11;
  ulong uVar12;
  Cut_Man_t *p;
  Vec_Int_t *vFanCounts;
  Abc_ManCut_t *p_00;
  Vec_Ptr_t *pVVar13;
  ProgressBar *p_01;
  uint *puVar14;
  Abc_Obj_t *pAVar15;
  char *pcVar16;
  byte bVar17;
  uint uVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  long *plVar35;
  int iVar36;
  ulong uVar37;
  uint local_fc;
  uint local_f8;
  uint local_f4;
  ulong local_b8;
  int local_70;
  undefined8 auStack_68 [7];
  
  if ((pNtk->ntkFunc != ABC_FUNC_SOP) || (pNtk->ntkType != ABC_NTK_LOGIC)) {
    __assert_fail("Abc_NtkIsSopLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcLut.c"
                  ,0x5b,"int Abc_NtkSuperChoiceLut(Abc_Ntk_t *, int, int, int)");
  }
  if (nLutSize - 7U < 0xfffffffc) {
    iVar8 = 0;
    printf("LUT size (%d) does not belong to the interval: 3 <= LUT size <= %d\n",
           (ulong)(uint)nLutSize,6);
  }
  else if (nCutSizeMax < 0x10 && nLutSize < nCutSizeMax) {
    pVVar13 = pNtk->vCis;
    if (0 < pVVar13->nSize) {
      lVar9 = 0;
      do {
        puVar14 = (uint *)((long)pVVar13->pArray[lVar9] + 0x14);
        *puVar14 = *puVar14 & 0xfff;
        lVar9 = lVar9 + 1;
        pVVar13 = pNtk->vCis;
      } while (lVar9 < pVVar13->nSize);
    }
    pManScl = (Abc_ManScl_t *)malloc(0x80);
    pManScl->nLutSize = 0;
    pManScl->nCutSizeMax = 0;
    pManScl->nNodesMax = 0;
    pManScl->nWords = 0;
    pManScl->vLeaves = (Vec_Ptr_t *)0x0;
    pManScl->vVolume = (Vec_Ptr_t *)0x0;
    pManScl->pBSet[0] = 0;
    pManScl->pBSet[1] = 0;
    pManScl->pBSet[2] = 0;
    pManScl->pBSet[3] = 0;
    pManScl->pBSet[4] = 0;
    pManScl->pBSet[5] = 0;
    pManScl->pBSet[6] = 0;
    pManScl->pBSet[7] = 0;
    pManScl->pBSet[8] = 0;
    pManScl->pBSet[9] = 0;
    pManScl->pBSet[10] = 0;
    pManScl->pBSet[0xb] = 0;
    pManScl->pBSet[0xc] = 0;
    pManScl->pBSet[0xd] = 0;
    *(undefined8 *)(pManScl->pBSet + 0xe) = 0;
    pManScl->uTruth = (uint *)0x0;
    pManScl->uVars = (uint **)0x0;
    pManScl->uSims = (uint **)0x0;
    pManScl->uCofs = (uint **)0x0;
    pManScl->nLutSize = nLutSize;
    pManScl->nCutSizeMax = nCutSizeMax;
    pManScl->nNodesMax = 1000;
    bVar17 = (char)nCutSizeMax - 5;
    iVar27 = 1 << (bVar17 & 0x1f);
    if (nCutSizeMax < 6) {
      iVar27 = 1;
    }
    pManScl->nWords = iVar27;
    if (nCutSizeMax < 6) {
      bVar17 = 0;
    }
    ppuVar10 = (uint **)Extra_ArrayAlloc(nCutSizeMax,iVar27,4);
    pManScl->uVars = ppuVar10;
    ppuVar11 = (uint **)Extra_ArrayAlloc(1000,iVar27,4);
    pManScl->uSims = ppuVar11;
    ppuVar11 = (uint **)Extra_ArrayAlloc(2 << ((byte)nLutSize & 0x1f),iVar27,4);
    pManScl->uCofs = ppuVar11;
    memset(*ppuVar10,0,(long)((nCutSizeMax << (bVar17 & 0x1f)) << 2));
    if (0 < nCutSizeMax) {
      uVar26 = iVar27 * 0x20;
      if (iVar27 * 0x20 < 2) {
        uVar26 = 1;
      }
      uVar12 = 0;
      do {
        if (0 < iVar27) {
          uVar18 = 0;
          do {
            if ((uVar18 & 1 << ((byte)uVar12 & 0x1f)) != 0) {
              ppuVar10[uVar12][uVar18 >> 5] =
                   ppuVar10[uVar12][uVar18 >> 5] | 1 << ((byte)uVar18 & 0x1f);
            }
            uVar18 = uVar18 + 1;
          } while (uVar26 != uVar18);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != (uint)nCutSizeMax);
    }
    Abc_NtkStartCutManForScl_Params._16_4_ = 0;
    Abc_NtkStartCutManForScl_Params._40_8_ = 0;
    Abc_NtkStartCutManForScl_Params._64_8_ = 0;
    Abc_NtkStartCutManForScl_Params._48_8_ = 0;
    Abc_NtkStartCutManForScl_Params._56_8_ = 0;
    Abc_NtkStartCutManForScl_Params._4_4_ = 500;
    Abc_NtkStartCutManForScl_Params._0_4_ = nLutSize;
    Abc_NtkStartCutManForScl_Params._20_4_ = 0;
    Abc_NtkStartCutManForScl_Params._24_4_ = 1;
    Abc_NtkStartCutManForScl_Params._28_4_ = 0;
    Abc_NtkStartCutManForScl_Params._32_8_ = 0;
    Abc_NtkStartCutManForScl_Params._72_8_ = 0;
    Abc_NtkStartCutManForScl_Params._12_4_ = 0;
    Abc_NtkStartCutManForScl_Params._8_4_ = pNtk->vObjs->nSize;
    p = Cut_ManStart((Cut_Params_t *)Abc_NtkStartCutManForScl_Params);
    if (Abc_NtkStartCutManForScl_Params._32_4_ != 0) {
      vFanCounts = Abc_NtkFanoutCounts(pNtk);
      Cut_ManSetFanoutCounts(p,vFanCounts);
    }
    pVVar13 = pNtk->vCis;
    if (0 < pVVar13->nSize) {
      lVar9 = 0;
      do {
        if (0 < *(int *)((long)pVVar13->pArray[lVar9] + 0x2c)) {
          Cut_NodeSetTriv(p,*(int *)((long)pVVar13->pArray[lVar9] + 0x10));
        }
        lVar9 = lVar9 + 1;
        pVVar13 = pNtk->vCis;
      } while (lVar9 < pVVar13->nSize);
    }
    p_00 = Abc_NtkManCutStart(nCutSizeMax,100000,100000,100000);
    s_pLeaves = Abc_NtkManCutReadCutSmall(p_00);
    pVVar13 = Abc_NtkManCutReadVisited(p_00);
    pManScl->vVolume = pVVar13;
    iVar27 = pNtk->vObjs->nSize;
    p_01 = Extra_ProgressBarStart(_stdout,iVar27);
    pVVar13 = pNtk->vObjs;
    if (pVVar13->nSize < 1) {
      uVar26 = 0;
      local_f4 = 0;
      local_f8 = 0;
      local_fc = 0;
    }
    else {
      pBSet = pManScl->pBSet;
      lVar9 = 0;
      local_fc = 0;
      local_f8 = 0;
      local_f4 = 0;
      uVar26 = 0;
      do {
        pObj = (Abc_Obj_t *)pVVar13->pArray[lVar9];
        if (pObj != (Abc_Obj_t *)0x0) {
          if ((p_01 == (ProgressBar *)0x0) || (p_01->nItemsNext <= lVar9)) {
            Extra_ProgressBarUpdate_int(p_01,(int)lVar9,(char *)0x0);
          }
          if (iVar27 <= lVar9) break;
          if ((pObj->vFanins).nSize == 2) {
            puVar14 = (uint *)Abc_NodeGetCutsRecursive(p,pObj,0,0);
            if (puVar14 == (uint *)0x0) {
              __assert_fail("pCut != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcLut.c"
                            ,0xd8,"void Abc_NodeLutMap(Cut_Man_t *, Abc_Obj_t *)");
            }
            if (0xfff < *(uint *)&pObj->field_0x14) {
              __assert_fail("pObj->Level == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcLut.c"
                            ,0xd9,"void Abc_NodeLutMap(Cut_Man_t *, Abc_Obj_t *)");
            }
            *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 | 0xf4240000;
            while (puVar14 = *(uint **)(puVar14 + 4), puVar14 != (uint *)0x0) {
              uVar18 = 0;
              if (0xfffffff < *puVar14) {
                pVVar13 = pObj->pNtk->vObjs;
                uVar12 = 0;
                uVar18 = 0;
                do {
                  uVar29 = puVar14[uVar12 + 6];
                  if (((long)(int)uVar29 < 0) || (pVVar13->nSize <= (int)uVar29)) goto LAB_002d73f4;
                  uVar29 = *(uint *)((long)pVVar13->pArray[(int)uVar29] + 0x14) >> 0xc;
                  if (uVar18 <= uVar29) {
                    uVar18 = uVar29;
                  }
                  uVar12 = uVar12 + 1;
                } while (*puVar14 >> 0x1c != uVar12);
              }
              if (uVar18 < *(uint *)&pObj->field_0x14 >> 0xc) {
                *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xfff | uVar18 << 0xc;
              }
            }
            if (0xf423ffff < *(uint *)&pObj->field_0x14) {
              __assert_fail("pObj->Level < LARGE_LEVEL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcLut.c"
                            ,0xe9,"void Abc_NodeLutMap(Cut_Man_t *, Abc_Obj_t *)");
            }
            uVar26 = uVar26 + 1;
            *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 + 0x1000;
            pVVar13 = Abc_NodeFindCut(p_00,pObj,0);
            pManScl->vLeaves = pVVar13;
            if ((nLutSize < pVVar13->nSize) && (pManScl->vVolume->nSize < 0x3e9)) {
              Abc_NodeSuperChoiceCollect2(pObj,pVVar13,pManScl->vVolume);
              lVar25 = (long)pManScl->vVolume->nSize;
              if (lVar25 < 1) {
                __assert_fail("p->nSize > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                              ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
              }
              if ((Abc_Obj_t *)pManScl->vVolume->pArray[lVar25 + -1] != pObj) {
                __assert_fail("Vec_PtrEntryLast(p->vVolume) == pObj",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcLut.c"
                              ,0x21b,
                              "Abc_Obj_t *Abc_NodeSuperChoiceLut(Abc_ManScl_t *, Abc_Obj_t *)");
              }
              puVar14 = Abc_NodeSuperChoiceTruth(pManScl);
              pManScl->uTruth = puVar14;
              pVVar13 = pManScl->vLeaves;
              iVar8 = pVVar13->nSize;
              uVar18 = Extra_TruthSupport(puVar14,iVar8);
              uVar29 = (uVar18 >> 1 & 0x55555555) + (uVar18 & 0x55555555);
              uVar29 = (uVar29 >> 2 & 0x33333333) + (uVar29 & 0x33333333);
              uVar29 = (uVar29 >> 4 & 0x7070707) + (uVar29 & 0x7070707);
              uVar29 = (uVar29 >> 8 & 0xf000f) + (uVar29 & 0xf000f);
              iVar20 = (uVar29 >> 0x10) + (uVar29 & 0xffff);
              if (iVar8 < iVar20) {
                __assert_fail("nSuppVars <= nVars",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcLut.c"
                              ,0x222,
                              "Abc_Obj_t *Abc_NodeSuperChoiceLut(Abc_ManScl_t *, Abc_Obj_t *)");
              }
              if (iVar20 == 0) {
                *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xfff;
                pAVar15 = (Abc_Obj_t *)0x0;
              }
              else if (iVar20 == 1) {
                if (iVar8 < 1) {
LAB_002d7432:
                  __assert_fail("i < nVars",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcLut.c"
                                ,0x22e,
                                "Abc_Obj_t *Abc_NodeSuperChoiceLut(Abc_ManScl_t *, Abc_Obj_t *)");
                }
                lVar25 = 0;
                while ((uVar18 >> ((uint)lVar25 & 0x1f) & 1) == 0) {
                  lVar25 = lVar25 + 1;
                  if (iVar8 == (int)lVar25) goto LAB_002d7432;
                }
                if (pVVar13->nSize <= (int)(uint)lVar25) {
LAB_002d73f4:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                }
                *(uint *)&pObj->field_0x14 =
                     *(uint *)&pObj->field_0x14 & 0xfff |
                     *(uint *)((long)pVVar13->pArray[lVar25] + 0x14) & 0xfffff000;
                pAVar15 = (Abc_Obj_t *)0x0;
              }
              else {
                if (iVar20 != iVar8) {
                  ppuVar10 = pManScl->uCofs;
                  Extra_TruthShrink(*ppuVar10,puVar14,iVar20,iVar8,uVar18);
                  uVar29 = 1 << ((byte)iVar8 - 5 & 0x1f);
                  if (iVar8 < 6) {
                    uVar29 = 1;
                  }
                  if (0 < (int)uVar29) {
                    puVar3 = *ppuVar10;
                    lVar25 = (ulong)uVar29 + 1;
                    do {
                      puVar14[lVar25 + -2] = puVar3[lVar25 + -2];
                      lVar25 = lVar25 + -1;
                    } while (1 < lVar25);
                  }
                  Abc_NodeLeavesRemove(pVVar13,~(-1 << ((byte)iVar8 & 0x1f) | uVar18),iVar8);
                }
                pVVar13 = pManScl->vLeaves;
                iVar20 = pVVar13->nSize;
                iVar8 = pManScl->nLutSize;
                if (iVar8 < iVar20) {
                  do {
                    if (iVar20 < 1) goto LAB_002d73f4;
                    pNtk_00 = ((Abc_Obj_t *)*pVVar13->pArray)->pNtk;
                    Abc_NodeDecomposeSort((Abc_Obj_t **)pVVar13->pArray,iVar20,pBSet,iVar8);
                    iVar8 = pManScl->pBSet[0];
                    if ((long)iVar8 < 0) goto LAB_002d73f4;
                    iVar28 = pManScl->vLeaves->nSize;
                    if (iVar28 <= iVar8) goto LAB_002d73f4;
                    iVar21 = pManScl->pBSet[1];
                    if (((long)iVar21 < 0) || (iVar28 <= iVar21)) goto LAB_002d73f4;
                    ppvVar5 = pManScl->vLeaves->pArray;
                    if (*(uint *)((long)ppvVar5[iVar21] + 0x14) >> 0xc <
                        *(uint *)((long)ppvVar5[iVar8] + 0x14) >> 0xc) {
                      __assert_fail("((Abc_Obj_t *)Vec_PtrEntry(p->vLeaves, p->pBSet[0]))->Level <= ((Abc_Obj_t *)Vec_PtrEntry(p->vLeaves, p->pBSet[1]))->Level"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcLut.c"
                                    ,0x2ae,"int Abc_NodeDecomposeStep(Abc_ManScl_t *)");
                    }
                    uVar12 = (ulong)(uint)(1 << ((byte)iVar20 - 5 & 0x1f));
                    if (iVar20 < 6) {
                      uVar12 = 1;
                    }
                    iVar8 = (int)uVar12;
                    if (0 < iVar8) {
                      puVar14 = pManScl->uTruth;
                      puVar3 = pManScl->uCofs[1];
                      lVar25 = uVar12 + 1;
                      do {
                        puVar3[lVar25 + -2] = puVar14[lVar25 + -2];
                        lVar25 = lVar25 + -1;
                      } while (1 < lVar25);
                    }
                    iVar28 = pManScl->nLutSize;
                    if (iVar28 < 1) {
                      iVar21 = 2;
                    }
                    else {
                      uVar37 = 2;
                      lVar25 = 0;
                      do {
                        if (lVar25 != 0x1f) {
                          iVar28 = 1 << ((byte)lVar25 & 0x1f);
                          if (iVar28 < 2) {
                            iVar28 = 1;
                          }
                          uVar37 = (ulong)(int)uVar37;
                          ppuVar10 = pManScl->uCofs;
                          iVar21 = pManScl->pBSet[lVar25];
                          iVar36 = 0;
                          do {
                            puVar14 = ppuVar10[uVar37];
                            puVar3 = ppuVar10[(int)(((uint)(uVar37 >> 0x1f) & 1) + (int)uVar37) >> 1
                                             ];
                            lVar19 = uVar12 + 1;
                            if (0 < iVar8) {
                              do {
                                puVar14[lVar19 + -2] = puVar3[lVar19 + -2];
                                lVar19 = lVar19 + -1;
                              } while (1 < lVar19);
                            }
                            if (0 < iVar8) {
                              puVar4 = ppuVar10[uVar37 + 1];
                              lVar19 = uVar12 + 1;
                              do {
                                puVar4[lVar19 + -2] = puVar3[lVar19 + -2];
                                lVar19 = lVar19 + -1;
                              } while (1 < lVar19);
                            }
                            Extra_TruthCofactor0(puVar14,iVar20,iVar21);
                            Extra_TruthCofactor1(pManScl->uCofs[uVar37 + 1],iVar20,iVar21);
                            uVar37 = uVar37 + 2;
                            iVar36 = iVar36 + 1;
                          } while (iVar36 != iVar28);
                        }
                        iVar21 = (int)uVar37;
                        lVar25 = lVar25 + 1;
                        iVar28 = pManScl->nLutSize;
                      } while (lVar25 < iVar28);
                    }
                    if (iVar21 != 2 << ((byte)iVar28 & 0x1f)) {
                      __assert_fail("c == (2 << p->nLutSize)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcLut.c"
                                    ,699,"int Abc_NodeDecomposeStep(Abc_ManScl_t *)");
                    }
                    uVar18 = 1 << ((byte)iVar28 & 0x1f);
                    uVar37 = 0;
                    if (iVar28 != 0x1f) {
                      uVar23 = 1;
                      if (1 < (int)uVar18) {
                        uVar23 = (ulong)uVar18;
                      }
                      ppuVar10 = pManScl->uCofs;
                      uVar30 = 0;
                      uVar37 = 0;
                      do {
                        iVar21 = (int)uVar37;
                        uVar31 = 0;
                        if (0 < iVar21) {
                          uVar33 = 0;
                          do {
                            uVar31 = uVar12;
                            do {
                              if ((int)uVar31 < 1) {
                                cVar1 = (&Abc_NodeDecomposeStep_nCofClasses)[uVar33];
                                (&Abc_NodeDecomposeStep_nCofClasses)[uVar33] = cVar1 + '\x01';
                                (&Abc_NodeDecomposeStep_pCofClasses)[(long)cVar1 + uVar33 * 0x40] =
                                     (char)uVar30;
                                uVar31 = uVar33;
                                goto LAB_002d6afd;
                              }
                              lVar25 = uVar31 - 1;
                              lVar19 = uVar31 - 1;
                              uVar31 = uVar31 - 1;
                            } while (ppuVar10[(long)(int)uVar18 + uVar30][lVar25] ==
                                     ppuVar10[(long)(char)(&Abc_NodeDecomposeStep_pCofClasses)
                                                          [uVar33 * 0x40] + (long)(int)uVar18]
                                     [lVar19]);
                            uVar33 = uVar33 + 1;
                            uVar31 = uVar37;
                          } while (uVar33 != uVar37);
                        }
LAB_002d6afd:
                        if ((int)uVar31 == iVar21) {
                          (&Abc_NodeDecomposeStep_nCofClasses)[iVar21] = 1;
                          (&Abc_NodeDecomposeStep_pCofClasses)[(long)iVar21 * 0x40] = (char)uVar30;
                          if ((int)uVar18 / 2 <= iVar21) {
                            pVVar13 = pManScl->vLeaves;
                            if (pVVar13->nSize < 1) {
                              pAVar15 = (Abc_Obj_t *)0x0;
                            }
                            else {
                              lVar25 = 0;
                              do {
                                pAVar15 = (Abc_Obj_t *)pVVar13->pArray[lVar25];
                                if (((*(uint *)&pAVar15->field_0x14 & 0xf) == 7) &&
                                   ((pAVar15->vFanouts).nSize == 0)) {
                                  Abc_NtkDeleteObj_rec(pAVar15,1);
                                }
                                lVar25 = lVar25 + 1;
                                pVVar13 = pManScl->vLeaves;
                              } while (lVar25 < pVVar13->nSize);
                              pAVar15 = (Abc_Obj_t *)0x0;
                            }
                            goto LAB_002d7200;
                          }
                          uVar37 = (ulong)(iVar21 + 1);
                        }
                        uVar30 = uVar30 + 1;
                      } while (uVar30 != uVar23);
                    }
                    uVar29 = (uint)uVar37;
                    uVar23 = uVar37;
                    if (1 < uVar29) {
                      uVar7 = uVar29 - 1;
                      if (uVar7 == 0) {
                        uVar23 = 0;
                      }
                      else {
                        uVar22 = 0x1f;
                        if (uVar7 != 0) {
                          for (; uVar7 >> uVar22 == 0; uVar22 = uVar22 - 1) {
                          }
                        }
                        uVar23 = (ulong)((uVar22 ^ 0xffffffe0) + 0x21);
                      }
                    }
                    iVar21 = (int)uVar23;
                    if (iVar28 <= iVar21) {
                      __assert_fail("nVarsNew < p->nLutSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcLut.c"
                                    ,0x2d6,"int Abc_NodeDecomposeStep(Abc_ManScl_t *)");
                    }
                    puVar14 = pManScl->uTruth;
                    if (0 < iVar8) {
                      memset(puVar14,0,uVar12 * 4);
                    }
                    if (0 < (int)uVar29) {
                      ppuVar10 = pManScl->uCofs;
                      lVar25 = uVar12 + 1;
                      uVar30 = 0;
                      do {
                        puVar3 = ppuVar10[(long)(char)(&Abc_NodeDecomposeStep_pCofClasses)
                                                      [uVar30 * 0x40] + (long)(int)uVar18];
                        if (iVar21 != 0) {
                          ppuVar11 = pManScl->uVars;
                          uVar31 = 0;
                          do {
                            puVar4 = ppuVar11[pBSet[uVar31]];
                            if (((uint)uVar30 >> ((uint)uVar31 & 0x1f) & 1) == 0) {
                              lVar19 = lVar25;
                              if (0 < iVar8) {
                                do {
                                  puVar3[lVar19 + -2] = puVar3[lVar19 + -2] & ~puVar4[lVar19 + -2];
                                  lVar19 = lVar19 + -1;
                                } while (1 < lVar19);
                              }
                            }
                            else {
                              lVar19 = lVar25;
                              if (0 < iVar8) {
                                do {
                                  puVar3[lVar19 + -2] = puVar3[lVar19 + -2] & puVar4[lVar19 + -2];
                                  lVar19 = lVar19 + -1;
                                } while (1 < lVar19);
                              }
                            }
                            uVar31 = uVar31 + 1;
                          } while (uVar31 != uVar23);
                        }
                        lVar19 = lVar25;
                        if (0 < iVar8) {
                          do {
                            puVar4 = puVar14 + lVar19 + -2;
                            *puVar4 = *puVar4 | puVar3[lVar19 + -2];
                            lVar19 = lVar19 + -1;
                          } while (1 < lVar19);
                        }
                        uVar30 = uVar30 + 1;
                      } while (uVar30 != uVar37);
                    }
                    if (iVar21 != 0) {
                      puVar14 = *pManScl->uCofs;
                      uVar30 = (ulong)(uint)(1 << ((char)pManScl->nLutSize - 5U & 0x1f));
                      if (pManScl->nLutSize < 6) {
                        uVar30 = 1;
                      }
                      local_b8 = 0;
                      do {
                        local_70 = (int)uVar30;
                        if (0 < local_70) {
                          memset(puVar14,0,uVar30 * 4);
                        }
                        if (0 < (int)uVar29) {
                          uVar31 = 0;
                          do {
                            if (((1 << ((byte)local_b8 & 0x1f) & (uint)uVar31) != 0) &&
                               (cVar1 = (&Abc_NodeDecomposeStep_nCofClasses)[uVar31],
                               0 < (long)cVar1)) {
                              puVar3 = pManScl->uCofs[1];
                              uVar18 = pManScl->nLutSize;
                              uVar33 = (ulong)(uint)(1 << ((char)uVar18 - 5U & 0x1f));
                              if ((int)uVar18 < 6) {
                                uVar33 = 1;
                              }
                              lVar25 = 0;
                              do {
                                if (0 < (int)uVar33) {
                                  memset(puVar3,0xff,uVar33 * 4);
                                }
                                uVar7 = uVar18;
                                if (0 < (int)uVar18) {
                                  uVar7 = pManScl->nLutSize;
                                  uVar24 = 1;
                                  if (1 < (int)uVar7) {
                                    uVar24 = (ulong)uVar7;
                                  }
                                  cVar2 = (&Abc_NodeDecomposeStep_pCofClasses)
                                          [lVar25 + uVar31 * 0x40];
                                  ppuVar10 = pManScl->uVars;
                                  uVar32 = 0;
                                  uVar22 = uVar18;
                                  do {
                                    uVar34 = (ulong)(uint)(1 << ((char)uVar22 - 5U & 0x1f));
                                    if ((int)uVar22 < 6) {
                                      uVar34 = 1;
                                    }
                                    puVar4 = ppuVar10[uVar32];
                                    if (((uint)(int)cVar2 >> (~(uint)uVar32 + uVar22 & 0x1f) & 1) ==
                                        0) {
                                      if (0 < (int)uVar34) {
                                        lVar19 = uVar34 + 1;
                                        do {
                                          puVar3[lVar19 + -2] =
                                               puVar3[lVar19 + -2] & ~puVar4[lVar19 + -2];
                                          lVar19 = lVar19 + -1;
                                        } while (1 < lVar19);
                                      }
                                    }
                                    else if (0 < (int)uVar34) {
                                      lVar19 = uVar34 + 1;
                                      do {
                                        puVar3[lVar19 + -2] =
                                             puVar3[lVar19 + -2] & puVar4[lVar19 + -2];
                                        lVar19 = lVar19 + -1;
                                      } while (1 < lVar19);
                                    }
                                    uVar32 = uVar32 + 1;
                                    uVar22 = uVar7;
                                  } while (uVar32 != uVar24);
                                }
                                uVar22 = 1 << ((char)uVar7 - 5U & 0x1f);
                                if ((int)uVar7 < 6) {
                                  uVar22 = 1;
                                }
                                if (0 < (int)uVar22) {
                                  lVar19 = (ulong)uVar22 + 1;
                                  do {
                                    puVar14[lVar19 + -2] =
                                         puVar14[lVar19 + -2] | puVar3[lVar19 + -2];
                                    lVar19 = lVar19 + -1;
                                  } while (1 < lVar19);
                                }
                                lVar25 = lVar25 + 1;
                              } while (lVar25 != cVar1);
                            }
                            uVar31 = uVar31 + 1;
                          } while (uVar31 != uVar37);
                        }
                        pAVar15 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_NODE);
                        iVar28 = pManScl->nLutSize;
                        if (0 < iVar28) {
                          pVVar13 = pManScl->vLeaves;
                          lVar25 = 0;
                          do {
                            iVar28 = pManScl->pBSet[lVar25];
                            if (((long)iVar28 < 0) || (pVVar13->nSize <= iVar28)) goto LAB_002d73f4;
                            Abc_ObjAddFanin(pAVar15,(Abc_Obj_t *)pVVar13->pArray[iVar28]);
                            lVar25 = lVar25 + 1;
                            iVar28 = pManScl->nLutSize;
                          } while (lVar25 < iVar28);
                        }
                        pcVar16 = Abc_SopCreateFromTruth
                                            ((Mem_Flex_t *)pNtk_00->pManFunc,iVar28,puVar14);
                        (pAVar15->field_5).pData = pcVar16;
                        lVar25 = (long)(pAVar15->vFanins).nSize;
                        if (lVar25 < 1) {
                          uVar18 = 0x1000;
                        }
                        else {
                          lVar19 = 0;
                          uVar18 = 0;
                          do {
                            uVar7 = *(uint *)((long)pAVar15->pNtk->vObjs->pArray
                                                    [(pAVar15->vFanins).pArray[lVar19]] + 0x14) >>
                                    0xc;
                            if (uVar7 < uVar18) {
                              uVar7 = uVar18;
                            }
                            uVar18 = uVar7;
                            lVar19 = lVar19 + 1;
                          } while (lVar25 != lVar19);
                          uVar18 = uVar18 * 0x1000 + 0x1000;
                        }
                        *(uint *)&pAVar15->field_0x14 =
                             *(uint *)&pAVar15->field_0x14 & 0xfff | uVar18;
                        auStack_68[local_b8] = pAVar15;
                        local_b8 = local_b8 + 1;
                      } while (local_b8 != uVar23);
                      pVVar13 = pManScl->vLeaves;
                      uVar37 = 0;
                      do {
                        iVar28 = pBSet[uVar37];
                        if (((long)iVar28 < 0) || (pVVar13->nSize <= iVar28)) {
                          __assert_fail("i >= 0 && i < p->nSize",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
                        }
                        pVVar13->pArray[iVar28] = (void *)auStack_68[uVar37];
                        uVar37 = uVar37 + 1;
                      } while (uVar23 != uVar37);
                    }
                    uVar18 = 0;
                    if (iVar21 < pManScl->nLutSize) {
                      uVar18 = 0;
                      do {
                        uVar18 = uVar18 | 1 << ((byte)pBSet[uVar23] & 0x1f);
                        uVar23 = uVar23 + 1;
                      } while ((uint)pManScl->nLutSize != uVar23);
                    }
                    Abc_NodeLeavesRemove(pManScl->vLeaves,uVar18,iVar20);
                    Extra_TruthShrink(*pManScl->uCofs,pManScl->uTruth,
                                      (iVar21 + iVar20) - pManScl->nLutSize,iVar20,
                                      ~(-1 << ((byte)iVar20 & 0x1f) | uVar18));
                    puVar14 = pManScl->uTruth;
                    if (0 < iVar8) {
                      puVar3 = *pManScl->uCofs;
                      lVar25 = uVar12 + 1;
                      do {
                        puVar14[lVar25 + -2] = puVar3[lVar25 + -2];
                        lVar25 = lVar25 + -1;
                      } while (1 < lVar25);
                    }
                    iVar8 = Extra_TruthVarInSupport
                                      (puVar14,iVar20,(iVar21 + iVar20) - pManScl->nLutSize);
                    if (iVar8 != 0) {
                      __assert_fail("!Extra_TruthVarInSupport( p->uTruth, nVars, nVars - p->nLutSize + nVarsNew )"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcLut.c"
                                    ,0x30e,"int Abc_NodeDecomposeStep(Abc_ManScl_t *)");
                    }
                    pVVar13 = pManScl->vLeaves;
                    iVar20 = pVVar13->nSize;
                    iVar8 = pManScl->nLutSize;
                  } while (iVar8 < iVar20);
                }
                pAVar15 = Abc_NtkCreateObj(pObj->pNtk,ABC_OBJ_NODE);
                pVVar13 = pManScl->vLeaves;
                iVar8 = pVVar13->nSize;
                if (0 < iVar8) {
                  lVar25 = 0;
                  do {
                    Abc_ObjAddFanin(pAVar15,(Abc_Obj_t *)pVVar13->pArray[lVar25]);
                    lVar25 = lVar25 + 1;
                    pVVar13 = pManScl->vLeaves;
                    iVar8 = pVVar13->nSize;
                  } while (lVar25 < iVar8);
                }
                pcVar16 = Abc_SopCreateFromTruth
                                    ((Mem_Flex_t *)pObj->pNtk->pManFunc,iVar8,pManScl->uTruth);
                (pAVar15->field_5).pData = pcVar16;
                lVar25 = (long)(pAVar15->vFanins).nSize;
                if (lVar25 < 1) {
                  uVar18 = 0x1000;
                }
                else {
                  lVar19 = 0;
                  uVar18 = 0;
                  do {
                    uVar29 = *(uint *)((long)pAVar15->pNtk->vObjs->pArray
                                             [(pAVar15->vFanins).pArray[lVar19]] + 0x14) >> 0xc;
                    if (uVar29 < uVar18) {
                      uVar29 = uVar18;
                    }
                    uVar18 = uVar29;
                    lVar19 = lVar19 + 1;
                  } while (lVar25 != lVar19);
                  uVar18 = uVar18 * 0x1000 + 0x1000;
                }
                *(uint *)&pAVar15->field_0x14 = *(uint *)&pAVar15->field_0x14 & 0xfff | uVar18;
              }
LAB_002d7200:
              local_f4 = local_f4 + 1;
              if (pAVar15 != (Abc_Obj_t *)0x0) {
                local_f8 = local_f8 + 1;
                if (*(uint *)&pAVar15->field_0x14 >> 0xc < *(uint *)&pObj->field_0x14 >> 0xc) {
                  *(uint *)&pObj->field_0x14 =
                       *(uint *)&pObj->field_0x14 & 0xfff |
                       *(uint *)&pAVar15->field_0x14 & 0xfffff000;
                  local_fc = local_fc + 1;
                }
                else {
                  Abc_NtkDeleteObj_rec(pAVar15,1);
                }
              }
            }
          }
        }
        lVar9 = lVar9 + 1;
        pVVar13 = pNtk->vObjs;
      } while (lVar9 < pVVar13->nSize);
    }
    Extra_ProgressBarStop(p_01);
    if (pManScl->uVars != (uint **)0x0) {
      free(pManScl->uVars);
      pManScl->uVars = (uint **)0x0;
    }
    if (pManScl->uSims != (uint **)0x0) {
      free(pManScl->uSims);
      pManScl->uSims = (uint **)0x0;
    }
    if (pManScl->uCofs != (uint **)0x0) {
      free(pManScl->uCofs);
      pManScl->uCofs = (uint **)0x0;
    }
    if (pManScl != (Abc_ManScl_t *)0x0) {
      free(pManScl);
    }
    Abc_NtkManCutStop(p_00);
    Cut_ManStop(p);
    lVar9 = (long)pNtk->vCos->nSize;
    if (lVar9 < 1) {
      uVar12 = 0;
    }
    else {
      lVar25 = 0;
      uVar12 = 0;
      do {
        plVar35 = (long *)pNtk->vCos->pArray[lVar25];
        plVar35 = *(long **)(*(long *)(*(long *)(*plVar35 + 0x20) + 8) +
                            (long)*(int *)plVar35[4] * 8);
        if (*(int *)((long)plVar35 + 0x1c) == 1) {
          plVar35 = *(long **)(*(long *)(*(long *)(*plVar35 + 0x20) + 8) +
                              (long)*(int *)plVar35[4] * 8);
        }
        uVar18 = *(uint *)((long)plVar35 + 0x14) >> 0xc;
        if ((uint)uVar12 <= uVar18) {
          uVar12 = (ulong)uVar18;
        }
        lVar25 = lVar25 + 1;
      } while (lVar9 != lVar25);
    }
    if (fVerbose != 0) {
      printf("Try = %d. Dec = %d. Exist = %d. Use = %d. SUPER = %d levels of %d-LUTs.\n",
             (ulong)uVar26,(ulong)local_f4,(ulong)local_f8,(ulong)local_fc,uVar12,nLutSize);
    }
    lVar9 = (long)pNtk->vObjs->nSize;
    if (0 < lVar9) {
      ppvVar5 = pNtk->vObjs->pArray;
      lVar25 = 0;
      do {
        pvVar6 = ppvVar5[lVar25];
        if (pvVar6 != (void *)0x0) {
          *(undefined8 *)((long)pvVar6 + 8) = 0;
        }
        lVar25 = lVar25 + 1;
      } while (lVar9 != lVar25);
    }
    iVar27 = Abc_NtkCheck(pNtk);
    iVar8 = 1;
    if (iVar27 == 0) {
      puts("Abc_NtkSuperChoiceLut: The network check has failed.");
      iVar8 = 0;
    }
  }
  else {
    iVar8 = 0;
    printf("Cut size (%d) does not belong to the interval: LUT size (%d) < Cut size <= %d\n",
           (ulong)(uint)nCutSizeMax,(ulong)(uint)nLutSize,0xf);
  }
  return iVar8;
}

Assistant:

int Abc_NtkSuperChoiceLut( Abc_Ntk_t * pNtk, int nLutSize, int nCutSizeMax, int fVerbose )
{
    ProgressBar * pProgress;
    Abc_ManCut_t * pManCut;
    Abc_ManScl_t * pManScl;
    Cut_Man_t * pManCuts;
    Abc_Obj_t * pObj, * pFanin, * pObjTop;
    int i, LevelMax, nNodes;
    int nNodesTried, nNodesDec, nNodesExist, nNodesUsed;

    assert( Abc_NtkIsSopLogic(pNtk) );
    if ( nLutSize < 3 || nLutSize > SCL_LUT_MAX )
    {
        printf( "LUT size (%d) does not belong to the interval: 3 <= LUT size <= %d\n", nLutSize, SCL_LUT_MAX );
        return 0;
    }
    if ( nCutSizeMax <= nLutSize || nCutSizeMax > SCL_VARS_MAX )
    {
        printf( "Cut size (%d) does not belong to the interval: LUT size (%d) < Cut size <= %d\n", nCutSizeMax, nLutSize, SCL_VARS_MAX );
        return 0;
    }

    assert( nLutSize <= SCL_LUT_MAX );
    assert( nCutSizeMax <= SCL_VARS_MAX );
    nNodesTried = nNodesDec = nNodesExist = nNodesUsed = 0;

    // set the delays of the CIs
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->Level = 0;

//Abc_NtkLevel( pNtk );
 
    // start the managers
    pManScl = Abc_ManSclStart( nLutSize, nCutSizeMax, 1000 );
    pManCuts = Abc_NtkStartCutManForScl( pNtk, nLutSize );
    pManCut = Abc_NtkManCutStart( nCutSizeMax, 100000, 100000, 100000 );
    s_pLeaves = Abc_NtkManCutReadCutSmall( pManCut );
    pManScl->vVolume = Abc_NtkManCutReadVisited( pManCut );

    // process each internal node (assuming topological order of nodes!!!)
    nNodes = Abc_NtkObjNumMax(pNtk);
    pProgress = Extra_ProgressBarStart( stdout, nNodes );
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
//        if ( i != nNodes-1 )
//            continue;
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        if ( i >= nNodes )
            break;
        if ( Abc_ObjFaninNum(pObj) != 2 )
            continue;
        nNodesTried++;

        // map this node using regular cuts
//        pObj->Level = 0;
        Abc_NodeLutMap( pManCuts, pObj );
        // compute the cut
        pManScl->vLeaves = Abc_NodeFindCut( pManCut, pObj, 0 );
        if ( Vec_PtrSize(pManScl->vLeaves) <= nLutSize )
            continue;
        // get the volume of the cut
        if ( Vec_PtrSize(pManScl->vVolume) > SCL_NODE_MAX )
            continue;
        nNodesDec++;

        // decompose the cut
        pObjTop = Abc_NodeSuperChoiceLut( pManScl, pObj );
        if ( pObjTop == NULL )
            continue;
        nNodesExist++;

        // if there is no delay improvement, skip; otherwise, update level
        if ( pObjTop->Level >= pObj->Level )
        {
            Abc_NtkDeleteObj_rec( pObjTop, 1 );
            continue;
        }
        pObj->Level = pObjTop->Level;
        nNodesUsed++;
    }
    Extra_ProgressBarStop( pProgress );

    // delete the managers
    Abc_ManSclStop( pManScl );
    Abc_NtkManCutStop( pManCut );
    Cut_ManStop( pManCuts );

    // get the largest arrival time
    LevelMax = 0;
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pFanin = Abc_ObjFanin0( pObj );
        // skip inv/buf
        if ( Abc_ObjFaninNum(pFanin) == 1 )
            pFanin = Abc_ObjFanin0( pFanin );
        // get the new level
        LevelMax = Abc_MaxInt( LevelMax, (int)pFanin->Level );
    }

    if ( fVerbose )
    printf( "Try = %d. Dec = %d. Exist = %d. Use = %d. SUPER = %d levels of %d-LUTs.\n", 
        nNodesTried, nNodesDec, nNodesExist, nNodesUsed, LevelMax, nLutSize );
//    if ( fVerbose )
//    printf( "The network is superchoiced for %d levels of %d-LUTs.\n", LevelMax, nLutSize );

    // clean the data field
    Abc_NtkForEachObj( pNtk, pObj, i )
        pObj->pNext = NULL;

    // check
    if ( !Abc_NtkCheck( pNtk ) )
    {
        printf( "Abc_NtkSuperChoiceLut: The network check has failed.\n" );
        return 0;
    }
    return 1;
}